

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputeLinkClosure
          (cmGeneratorTarget *this,string *config,LinkClosure *lc,bool secondPass)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  cmLinkImplementation *pcVar4;
  cmLinkImplItem *lib;
  pointer item;
  pointer lang;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  __node_base _Var5;
  string propagates;
  string local_158;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmTargetSelectLinker tsl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cmTargetCollectLinkLanguages cll;
  
  languages._M_h._M_buckets = &languages._M_h._M_single_bucket;
  languages._M_h._M_bucket_count = 1;
  languages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  languages._M_h._M_element_count = 0;
  languages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  languages._M_h._M_rehash_policy._M_next_resize = 0;
  languages._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar4 = GetLinkImplementation(this,config,Link,secondPass);
  if (pcVar4 != (cmLinkImplementation *)0x0) {
    std::__detail::
    _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&languages,
               (pcVar4->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (pcVar4->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::string((string *)&local_158,(string *)config);
    cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
              (&cll,this,&local_158,&languages,this,secondPass);
    std::__cxx11::string::~string((string *)&local_158);
    pcVar1 = (pcVar4->super_cmLinkImplementationLibraries).Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (item = (pcVar4->super_cmLinkImplementationLibraries).Libraries.
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start; item != pcVar1; item = item + 1) {
      cmTargetCollectLinkLanguages::Visit(&cll,&item->super_cmLinkItem);
    }
    ::cm::
    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&lc->Languages,&languages);
    if ((secondPass) || ((lc->LinkerLanguage)._M_string_length == 0)) {
      tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_header;
      tsl.Preference = 0;
      tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      tsl.GG = this->LocalGenerator->GlobalGenerator;
      pbVar2 = (pcVar4->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tsl.Target = this;
      tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           tsl.Preferred._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lang = (pcVar4->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; lang != pbVar2; lang = lang + 1) {
        cmTargetSelectLinker::Consider(&tsl,lang);
      }
      for (_Var5._M_nxt = languages._M_h._M_before_begin._M_nxt;
          _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
        std::operator+(&local_b8,"CMAKE_",(string *)(_Var5._M_nxt + 1));
        std::operator+(&propagates,&local_b8,"_LINKER_PREFERENCE_PROPAGATES");
        std::__cxx11::string::~string((string *)&local_b8);
        bVar3 = cmMakefile::IsOn(this->Makefile,&propagates);
        if (bVar3) {
          cmTargetSelectLinker::Consider(&tsl,(string *)(_Var5._M_nxt + 1));
        }
        std::__cxx11::string::~string((string *)&propagates);
      }
      cmTargetSelectLinker::Choose_abi_cxx11_(&propagates,&tsl);
      std::__cxx11::string::operator=((string *)lc,(string *)&propagates);
      std::__cxx11::string::~string((string *)&propagates);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&tsl.Preferred._M_t);
    }
    bVar3 = pcVar4->HadLinkLanguageSensitiveCondition;
    cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages(&cll);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&languages._M_h);
    return (bool)((cll.HadLinkLanguageSensitiveCondition | bVar3) & 1);
  }
  __assert_fail("impl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xb1d,
                "bool cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &, bool) const"
               );
}

Assistant:

bool cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc,
                                           bool secondPass) const
{
  // Get languages built in this target.
  std::unordered_set<std::string> languages;
  cmLinkImplementation const* impl =
    this->GetLinkImplementation(config, LinkInterfaceFor::Link, secondPass);
  assert(impl);
  languages.insert(impl->Languages.cbegin(), impl->Languages.cend());

  // Add interface languages from linked targets.
  // cmTargetCollectLinkLanguages cll(this, config, languages, this,
  // secondPass);
  cmTargetCollectLinkLanguages cll(this, config, languages, this, secondPass);
  for (cmLinkImplItem const& lib : impl->Libraries) {
    cll.Visit(lib);
  }

  // Store the transitive closure of languages.
  cm::append(lc.Languages, languages);

  // Choose the language whose linker should be used.
  if (secondPass || lc.LinkerLanguage.empty()) {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::string const& l : impl->Languages) {
      tsl.Consider(l);
    }

    // Now consider languages that propagate from linked targets.
    for (std::string const& lang : languages) {
      std::string propagates =
        "CMAKE_" + lang + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(lang);
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }

  return impl->HadLinkLanguageSensitiveCondition ||
    cll.GetHadLinkLanguageSensitiveCondition();
}